

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Export * kj::_::
         CopyConstructArray_<capnp::_::RpcSystemBase::RpcConnectionState::Export,_capnp::_::RpcSystemBase::RpcConnectionState::Export_*,_true,_false>
         ::apply(Export *pos,Export *start,Export *end)

{
  Export *location;
  Export *params;
  undefined1 local_30 [8];
  ExceptionGuard guard;
  Export *end_local;
  Export *start_local;
  Export *pos_local;
  
  guard.pos = end;
  ExceptionGuard::ExceptionGuard((ExceptionGuard *)local_30,pos);
  end_local = start;
  while (location = guard.start, end_local != guard.pos) {
    params = mv<capnp::_::RpcSystemBase::RpcConnectionState::Export>(end_local);
    ctor<capnp::_::RpcSystemBase::RpcConnectionState::Export,capnp::_::RpcSystemBase::RpcConnectionState::Export>
              (location,params);
    guard.start = guard.start + 1;
    end_local = end_local + 1;
  }
  local_30 = (undefined1  [8])guard.start;
  ExceptionGuard::~ExceptionGuard((ExceptionGuard *)local_30);
  return location;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) (void)implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }